

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall
Sequence::process_cluster_list1
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster2,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  Env *seqstrm;
  element_type *peVar1;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  uint uVar6;
  reference pvVar7;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar8;
  int iVar9;
  Sequence *pSVar10;
  undefined1 local_128 [16];
  Eqclass_S EQ;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  int msup;
  int esup;
  int lsup;
  Itemset_S ejoin;
  Itemset_S ljoin;
  Itemset_S mjoin;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_88;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  seqstrm = this->env;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar9 = iter + -1;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,iVar9);
  std::make_shared<Eqclass,int,int&>((int *)&EQ,(int *)&ljoin);
  fill_seq_template(&EQ,parent,2);
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             local_128,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             (cluster2->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  while (peVar4 = hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,
        hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
    peVar1 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar6 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    prune_decision((Sequence *)local_128,(Itemset_S *)this,&peVar4->theItem,(int)peVar1 + 0x10,uVar6
                  );
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar6 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pre_pruning(this,(Itemset_S *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                  uVar6,&((hdr1->
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,'\x01');
    }
    if ((ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
        ) && (pSVar10 = this,
             get_tmpnewf_intersect
                       (this,(Itemset_S *)
                             &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,&ejoin,
                        &mjoin,&lsup,&esup,&msup,
                        &(hdr2.
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->theItem,
                        &((hdr1->
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->theItem,iter),
             ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0)) {
      fill_join(pSVar10,(Itemset_S *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,
                &(hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar6 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,(Itemset_S *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   uVar6);
    }
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at
                         ((this->numLargeItemset).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(long)iVar9);
      peVar5 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *pvVar7 = *pvVar7 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar6 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar5,(ostream *)seqstrm,uVar6);
      }
      peVar3 = EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
      Eqclass::append(peVar3,(Itemset_S *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 local_128,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hdr2.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  }
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             local_128,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  while (peVar4 = hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,
        hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
    peVar1 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar6 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    prune_decision((Sequence *)local_128,(Itemset_S *)this,&peVar4->theItem,(int)peVar1 + 0x10,uVar6
                  );
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar6 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pre_pruning(this,(Itemset_S *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                  uVar6,&((hdr1->
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,'\0');
    }
    if ((ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
        ) && (pSVar10 = this,
             get_tmpnewf_intersect
                       (this,&ljoin,
                        (Itemset_S *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                        &mjoin,&lsup,&esup,&msup,
                        &(hdr2.
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->theItem,
                        &((hdr1->
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->theItem,iter),
             ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0)) {
      fill_join(pSVar10,(Itemset_S *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,
                &(hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar6 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,(Itemset_S *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                   uVar6);
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at
                         ((this->numLargeItemset).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(long)iVar9);
      peVar5 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *pvVar7 = *pvVar7 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar6 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar5,(ostream *)seqstrm,uVar6);
      }
      peVar3 = EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
      Eqclass::append2(peVar3,(Itemset_S *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 local_128,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hdr2.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  }
  if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
  goto LAB_0010e3fd;
  psVar8 = Eqclass::list(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((((psVar8->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->theSize < 1) &&
     (psVar8 = Eqclass::list2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     ((psVar8->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->theSize < 1)) {
LAB_0010e3e6:
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    p_Var2 = (__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *)local_128;
  }
  else {
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive != 0) {
      std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>);
      local_88.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      process_cluster1(this,(Eqclass_S *)&local_60,&local_88,iter + 1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.
                  super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      goto LAB_0010e3e6;
    }
    this_00 = (LargeL->
              super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>);
    Lists<std::shared_ptr<Eqclass>_>::append(this_00,(shared_ptr<Eqclass> *)&local_70);
    p_Var2 = &local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
LAB_0010e3fd:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Sequence::process_cluster_list1(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster2,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Eqclass_S EQ = make_shared<Eqclass>(iter - 1, eqtype);
    fill_seq_template(EQ, parent, 2);

    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;
    hdr2 = cluster2->head();
    for (; hdr2; hdr2 = hdr2->next()) {
        //ljoin = (Itemset_S )1;
        ljoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ(), LJOIN);
        ejoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ljoin, EQ->templ(), hdr1->item(), hdr2->item(), 1);
        if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ljoin) fill_join(ljoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) {
            post_pruning(ljoin, EQ->templ());
        }
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->templ());
            EQ->append(ljoin);
        }
    }

    //hdr2 = cluster1->head();
    //for (; hdr2 != hdr1; hdr2=hdr2->next()){
    hdr2 = hdr1->next();
    for (; hdr2 != nullptr; hdr2 = hdr2->next()) {
        //ejoin = (Itemset_S )1;
        ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ2(), EJOIN);
        ljoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ejoin, EQ->templ2(), hdr1->item(), hdr2->item(), 0);
        if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->templ2());
            EQ->append2(ejoin);
        }
    }

    if (EQ) {
        if ((EQ->list()->size() > 0) || (EQ->list2()->size() > 0)) {
            if (args->recursive) {
                //if (use_hash) insert_freqarray(EQ);
                process_cluster1(EQ, nullptr, iter + 1);
                EQ = nullptr;
            } else LargeL->append(EQ);
        } else {
            EQ = nullptr;
        }
    }
}